

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::find_child<NULLCPugiXML::predicate_nullc_node>
          (xml_node *this,predicate_nullc_node pred)

{
  bool bVar1;
  unspecified_bool_type p_Var2;
  xml_node *this_local;
  undefined1 local_1c [8];
  predicate_nullc_node pred_local;
  xml_node node;
  
  pred_local.callback.context._0_4_ = pred.callback.id;
  local_1c = (undefined1  [8])pred.callback.context;
  if (this->_root == (xml_node_struct *)0x0) {
    xml_node((xml_node *)((long)&pred_local.callback.context + 4));
  }
  else {
    pred_local.callback._4_8_ = first_child(this);
    while (p_Var2 = operator_cast_to_function_pointer
                              ((xml_node *)((long)&pred_local.callback.context + 4)),
          p_Var2 != (unspecified_bool_type)0x0) {
      bVar1 = NULLCPugiXML::predicate_nullc_node::operator()
                        ((predicate_nullc_node *)local_1c,
                         (xml_node *)((long)&pred_local.callback.context + 4));
      if (bVar1) {
        return (xml_node)(xml_node_struct *)pred_local.callback._4_8_;
      }
      pred_local.callback._4_8_ = next_sibling((xml_node *)((long)&pred_local.callback.context + 4))
      ;
    }
    xml_node((xml_node *)((long)&pred_local.callback.context + 4));
  }
  return (xml_node)(xml_node_struct *)pred_local.callback._4_8_;
}

Assistant:

xml_node find_child(Predicate pred) const
		{
			if (!_root) return xml_node();

			for (xml_node node = first_child(); node; node = node.next_sibling())
				if (pred(node))
					return node;

			return xml_node();
		}